

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
          (WindowedPiecewiseConstant2D *this,Array2D<float> *f,Allocator alloc)

{
  Array2D<float> *in_RDX;
  Array2D<float> *in_RSI;
  allocator_type in_RDI;
  SummedAreaTable *in_stack_ffffffffffffffc8;
  Allocator in_stack_ffffffffffffffd0;
  
  SummedAreaTable::SummedAreaTable(in_stack_ffffffffffffffc8,in_RSI,in_stack_ffffffffffffffd0);
  Array2D<float>::Array2D(in_RSI,in_RDX,in_RDI);
  return;
}

Assistant:

WindowedPiecewiseConstant2D(Array2D<Float> f, Allocator alloc = {})
        : sat(f, alloc), func(f, alloc) {}